

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O1

void printMemOperandEA(MCInst *MI,int opNum,SStream *O)

{
  undefined4 in_register_00000034;
  SStream *O_00;
  
  O_00 = (SStream *)CONCAT44(in_register_00000034,opNum);
  printOperand(MI,1,O_00);
  SStream_concat0(O_00,", ");
  printOperand(MI,2,O_00);
  return;
}

Assistant:

static void printMemOperandEA(MCInst *MI, int opNum, SStream *O)
{
	// when using stack locations for not load/store instructions
	// print the same way as all normal 3 operand instructions.
	printOperand(MI, opNum, O);
	SStream_concat0(O, ", ");
	printOperand(MI, opNum + 1, O);
	return;
}